

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

logic_t __thiscall slang::SVInt::operator[](SVInt *this,int32_t index)

{
  SVInt *pSVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  bitwidth_t bi;
  ulong uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  
  uVar8 = 0x80;
  if ((-1 < index) && (uVar3 = (this->super_SVIntStorage).bitWidth, (uint)index < uVar3)) {
    uVar6 = 1L << ((byte)index & 0x3f);
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    pSVar1 = (SVInt *)(puVar4 + ((uint)index >> 6));
    bVar2 = (this->super_SVIntStorage).unknownFlag;
    if ((bVar2 & 1U) != 0) {
      this = pSVar1;
    }
    if (0x40 < uVar3) {
      this = pSVar1;
    }
    uVar5 = (this->super_SVIntStorage).field_0.val;
    uVar8 = (uVar5 >> ((ulong)(uint)index & 0x3f) & 1) != 0;
    if ((bVar2 & 1U) != 0) {
      uVar7 = 0x80;
      if ((uVar5 & uVar6) != 0) {
        uVar7 = '@';
      }
      if ((puVar4[(uVar3 + 0x3f >> 6) + ((uint)index >> 6)] & uVar6) != 0) {
        uVar8 = uVar7;
      }
    }
  }
  return (logic_t)uVar8;
}

Assistant:

logic_t SVInt::operator[](int32_t index) const {
    bitwidth_t bi = bitwidth_t(index);
    if (index < 0 || bi >= bitWidth)
        return logic_t::x;

    bool bit = (maskBit(bi) & (isSingleWord() ? val : pVal[whichWord(bi)])) != 0;
    if (!unknownFlag)
        return logic_t(bit);

    bool unknownBit = (maskBit(bi) & pVal[whichWord(bi) + getNumWords(bitWidth, false)]) != 0;
    if (!unknownBit)
        return logic_t(bit);

    return bit ? logic_t::z : logic_t::x;
}